

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O0

void SubtractionHelper<signed_char,_unsigned_short,_2>::
     SubtractThrow<safeint_exception_handlers::SafeInt_InvalidParameter>
               (char *lhs,unsigned_short *rhs,char *result)

{
  char cVar1;
  ushort uVar2;
  char cVar3;
  undefined1 *in_RDX;
  ushort *in_RSI;
  char *in_RDI;
  int32_t tmp;
  
  cVar1 = *in_RDI;
  uVar2 = *in_RSI;
  cVar3 = std::numeric_limits<signed_char>::min();
  if ((int)cVar3 <= (int)((int)cVar1 - (uint)uVar2)) {
    *in_RDX = (char)((int)cVar1 - (uint)uVar2);
    return;
  }
  safeint_exception_handlers::SafeInt_InvalidParameter::SafeIntOnOverflow();
}

Assistant:

SAFEINT_CONSTEXPR14 static void SubtractThrow( const T& lhs, const U& rhs, T& result ) SAFEINT_CPP_THROW
    {
        // both values are 16-bit or less
        // rhs is unsigned - check only minimum
        std::int32_t tmp = lhs - rhs;

        if( tmp >= (std::int32_t)std::numeric_limits<T>::min() )
        {
            result = (T)tmp;
            return;
        }

        E::SafeIntOnOverflow();
    }